

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor.h
# Opt level: O1

uint32_t FastPForLib::PFor::determineBestBase(DATATYPE *in,size_t size)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint32_t b;
  uint uVar8;
  ulong uVar9;
  size_t sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 in_XMM8_Qa;
  undefined8 in_XMM8_Qb;
  uint32_t freqs [33];
  undefined1 local_a8 [64];
  undefined1 local_68 [64];
  undefined4 local_28;
  
  if (size != 0) {
    local_68 = ZEXT864(0) << 0x40;
    local_a8 = ZEXT864(0) << 0x40;
    local_28 = 0;
    sVar10 = 0x10000;
    if (size < 0x10000) {
      sVar10 = size;
    }
    uVar5 = 0;
    if (0x10000 < size) {
      uVar5 = rand();
      uVar5 = uVar5 % (uint)((int)size - (int)sVar10);
    }
    uVar9 = (ulong)uVar5;
    uVar6 = uVar9;
    while (uVar6 < sVar10 + uVar9) {
      uVar5 = uVar5 + 1;
      uVar8 = in[uVar6];
      if (uVar8 == 0) {
        uVar8 = 0;
      }
      else {
        iVar7 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> iVar7 == 0; iVar7 = iVar7 + -1) {
          }
        }
        uVar8 = iVar7 + 1;
      }
      *(int *)(local_a8 + (ulong)uVar8 * 4) = *(int *)(local_a8 + (ulong)uVar8 * 4) + 1;
      uVar6 = (ulong)uVar5;
    }
    uVar6 = 0x20;
    iVar7 = 0;
    uVar9 = 0x1f;
    auVar11 = ZEXT816(0x4040000000000000);
    do {
      iVar7 = iVar7 + *(int *)(local_a8 + uVar9 * 4 + 4);
      auVar3._8_8_ = in_XMM8_Qb;
      auVar3._0_8_ = in_XMM8_Qa;
      auVar3 = vcvtusi2sd_avx512f(auVar3,iVar7);
      auVar12._0_8_ = auVar3._0_8_ / (double)(long)sVar10;
      auVar12._8_8_ = auVar3._8_8_;
      if (iVar7 != 0) {
        auVar14 = vfmadd213sd_fma(ZEXT816(0x4060000000000000),auVar12,ZEXT816(0xbff0000000000000));
        auVar4._8_8_ = in_XMM8_Qb;
        auVar4._0_8_ = in_XMM8_Qa;
        auVar3 = vcvtusi2sd_avx512f(auVar4,1 << ((uint)uVar9 & 0x1f));
        auVar13._0_8_ = auVar14._0_8_ / (auVar12._0_8_ * auVar3._0_8_);
        auVar13._8_8_ = auVar14._8_8_;
        auVar12 = vmaxsd_avx(auVar13,auVar12);
      }
      auVar14._0_8_ = (double)(int)(uint)uVar9;
      auVar14._8_8_ = in_XMM8_Qb;
      auVar12 = vfmadd231sd_fma(auVar14,auVar12,ZEXT816(0x4040000000000000));
      if (auVar12._0_8_ <= auVar11._0_8_) {
        uVar6 = uVar9 & 0xffffffff;
      }
      uVar1 = vcmpsd_avx512f(auVar12,auVar11,6);
      bVar2 = (bool)((byte)uVar1 & 1);
      auVar11._0_8_ = (ulong)bVar2 * (long)auVar11._0_8_ + (ulong)!bVar2 * (long)auVar12._0_8_;
      auVar11._8_8_ = auVar12._8_8_;
      uVar9 = uVar9 - 1;
    } while (uVar9 < 0x20);
    return (uint32_t)uVar6;
  }
  return 0;
}

Assistant:

static uint32_t determineBestBase(const DATATYPE *in, size_t size) {
    if (size == 0)
      return 0;
    const size_t defaultsamplesize = 64 * 1024;
    // the original paper describes sorting
    // a sample, but this only makes sense if you
    // are coding a frame of reference.
    size_t samplesize = size > defaultsamplesize ? defaultsamplesize : size;
    uint32_t freqs[33];
    for (uint32_t k = 0; k <= 32; ++k)
      freqs[k] = 0;
    // we choose the sample to be consecutive
    uint32_t rstart =
        size > samplesize
            ? (rand() % (static_cast<uint32_t>(size - samplesize)))
            : 0U;
    for (uint32_t k = rstart; k < rstart + samplesize; ++k) {
      freqs[asmbits(in[k])]++;
    }
    uint32_t bestb = 32;
    uint32_t numberofexceptions = 0;
    double Erate = 0;
    double bestcost = 32;
    for (uint32_t b = bestb - 1; b < 32; --b) {
      numberofexceptions += freqs[b + 1];
      Erate = static_cast<double>(numberofexceptions) /
              static_cast<double>(samplesize);
      /**
      * though this is not explicit in the original paper, you
      * need to somehow compensate for compulsory exceptions
      * when the chosen number of bits is small.
      *
      * We use their formula (3.1.5) to estimate actual number
      * of total exceptions, including compulsory exceptions.
      */
      if (numberofexceptions > 0) {
        double altErate = (Erate * 128 - 1) / (Erate * (1U << b));
        if (altErate > Erate)
          Erate = altErate;
      }
      const double thiscost = b + Erate * 32;
      if (thiscost <= bestcost) {
        bestcost = thiscost;
        bestb = b;
      }
    }
    return bestb;
  }